

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_shapes.c
# Opt level: O0

greatest_test_res shape_compare(void)

{
  int iVar1;
  undefined1 local_168 [8];
  shape_t c;
  shape_t b;
  shape_t a;
  greatest_test_res local_c;
  
  memcpy(&b.dist_traveled,"SHAPE_ID",0x70);
  memcpy(&c.dist_traveled,"SHAPE_ID",0x70);
  memcpy(local_168,"SHAPE_ID",0x70);
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = equal_shape((shape_t *)&b.dist_traveled,(shape_t *)&c.dist_traveled);
  if (iVar1 == 1) {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_shape((shape_t *)&b.dist_traveled,(shape_t *)local_168);
    if (iVar1 == 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_shape((shape_t *)&c.dist_traveled,(shape_t *)local_168);
      if (iVar1 == 0) {
        greatest_info.msg = (char *)0x0;
        local_c = GREATEST_TEST_RES_PASS;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_shapes.c"
        ;
        greatest_info.fail_line = 0x37;
        greatest_info.msg = "0 != equal_shape(&b, &c)";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        local_c = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_shapes.c"
      ;
      greatest_info.fail_line = 0x36;
      greatest_info.msg = "0 != equal_shape(&a, &c)";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      local_c = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_shapes.c"
    ;
    greatest_info.fail_line = 0x35;
    greatest_info.msg = "1 != equal_shape(&a, &b)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    local_c = GREATEST_TEST_RES_FAIL;
  }
  return local_c;
}

Assistant:

TEST shape_compare(void) {
    shape_t a = {
        .id = "SHAPE_ID",
        .pt_lat = 123.0,
        .pt_lon = 0.3,
        .pt_sequence = 2,
        .dist_traveled = 2.7
    };

    shape_t b = {
        .id = "SHAPE_ID",
        .pt_lat = 123.0,
        .pt_lon = 0.3,
        .pt_sequence = 2,
        .dist_traveled = 2.7
    };

    shape_t c = {
        .id = "SHAPE_ID",
        .pt_lat = 123.1,
        .pt_lon = 0.3,
        .pt_sequence = 0,
        .dist_traveled = 2.6
    };

    ASSERT_EQ(1, equal_shape(&a, &b));
    ASSERT_EQ(0, equal_shape(&a, &c));
    ASSERT_EQ(0, equal_shape(&b, &c));

    PASS();
}